

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_program_t * ztast_program(ztast_t *ast,ztast_statement_t *statements)

{
  ztast_statement *in_RSI;
  long *in_RDI;
  ztast_program_t *program;
  ztast_program_t *local_8;
  
  local_8 = (ztast_program_t *)(*(code *)in_RDI[1])(8,in_RDI[3]);
  if (local_8 == (ztast_program_t *)0x0) {
    local_8 = (ztast_program_t *)0x0;
  }
  else {
    local_8->statements = in_RSI;
    *in_RDI = (long)local_8;
  }
  return local_8;
}

Assistant:

ztast_program_t *ztast_program(ztast_t *ast, ztast_statement_t *statements)
{
  ztast_program_t *program;

  assert(ast);
  /* statement may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_program\n");
#endif

  program = ZTAST_MALLOC(sizeof(*program));
  if (program == NULL)
    return NULL;

  program->statements = statements;

  /* Store the initial program pointer in ast_t.
   * This is here because it's awkward to do in the parser. */
  assert(ast->program == NULL);
  ast->program = program;

  return program;
}